

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

bool duckdb::LocalFileSystem::IsPrivateFile(string *path_p,FileOpener *opener)

{
  int iVar1;
  char *__file;
  IOException *this;
  allocator local_e9;
  string path;
  string local_c8;
  stat st;
  
  FileSystem::ExpandPath(&path,path_p,(optional_ptr<duckdb::FileOpener,_true>)opener);
  __file = NormalizeLocalPath(&path);
  iVar1 = lstat(__file,(stat *)&st);
  if (iVar1 == 0) {
    ::std::__cxx11::string::~string((string *)&path);
    return ((byte)st.st_mode & 0x3f) == 0;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_c8,
             "Failed to stat \'%s\' when checking file permissions, file may be missing or have incorrect permissions"
             ,&local_e9);
  IOException::IOException<char_const*>(this,&local_c8,path._M_dataplus._M_p);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool LocalFileSystem::IsPrivateFile(const string &path_p, FileOpener *opener) {
	auto path = FileSystem::ExpandPath(path_p, opener);
	auto normalized_path = NormalizeLocalPath(path);

	struct stat st;

	if (lstat(normalized_path, &st) != 0) {
		throw IOException(
		    "Failed to stat '%s' when checking file permissions, file may be missing or have incorrect permissions",
		    path.c_str());
	}

	// If group or other have any permission, the file is not private
	if (st.st_mode & (S_IRGRP | S_IWGRP | S_IXGRP | S_IROTH | S_IWOTH | S_IXOTH)) {
		return false;
	}

	return true;
}